

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O3

int lua_loadx(lua_State *L,lua_Reader reader,void *data,char *chunkname,char *mode)

{
  int iVar1;
  ulong uVar2;
  global_State *g;
  LexState ls;
  undefined1 auStack_b8 [56];
  undefined8 local_80;
  int local_74;
  lua_Reader local_70;
  void *local_68;
  char *local_50;
  char *local_48;
  undefined8 local_40;
  uint local_38;
  undefined8 local_30;
  uint local_28;
  
  local_50 = "?";
  if (chunkname != (char *)0x0) {
    local_50 = chunkname;
  }
  local_80 = 0;
  local_74 = 0;
  local_70 = reader;
  local_68 = data;
  local_48 = mode;
  iVar1 = lj_vm_cpcall(L,0,auStack_b8,cpparser);
  uVar2 = (ulong)(L->glref).ptr32;
  *(int *)(uVar2 + 0x20) = *(int *)(uVar2 + 0x20) - (int)((ulong)local_28 << 3);
  (**(code **)(uVar2 + 0x10))(*(undefined8 *)(uVar2 + 0x18),local_30,(ulong)local_28 << 3,0);
  *(int *)(uVar2 + 0x20) = *(int *)(uVar2 + 0x20) - (int)((ulong)local_38 << 4);
  (**(code **)(uVar2 + 0x10))(*(undefined8 *)(uVar2 + 0x18),local_40,(ulong)local_38 << 4,0);
  *(int *)(uVar2 + 0x20) = *(int *)(uVar2 + 0x20) - local_74;
  (**(code **)(uVar2 + 0x10))(*(undefined8 *)(uVar2 + 0x18),local_80,local_74,0);
  uVar2 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar2 + 0x24) <= *(uint *)(uVar2 + 0x20)) {
    lj_gc_step(L);
  }
  return iVar1;
}

Assistant:

LUA_API int lua_loadx(lua_State *L, lua_Reader reader, void *data,
		      const char *chunkname, const char *mode)
{
  LexState ls;
  int status;
  ls.rfunc = reader;
  ls.rdata = data;
  ls.chunkarg = chunkname ? chunkname : "?";
  ls.mode = mode;
  lj_str_initbuf(&ls.sb);
  status = lj_vm_cpcall(L, NULL, &ls, cpparser);
  lj_lex_cleanup(L, &ls);
  lj_gc_check(L);
  return status;
}